

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
TagVisitor<ModuleDefinitionFileTag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Accept(TagVisitor<ModuleDefinitionFileTag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,cmSourceFile *sf)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  string *psVar2;
  cmCustomCommand *pcVar3;
  string ext;
  allocator local_61;
  cmSourceFile *local_60;
  string local_58;
  string local_38;
  
  local_60 = sf;
  psVar2 = cmSourceFile::GetExtension_abi_cxx11_(sf);
  cmsys::SystemTools::LowerCase(&local_38,psVar2);
  pcVar3 = cmSourceFile::GetCustomCommand(sf);
  if ((pcVar3 != (cmCustomCommand *)0x0) || (this->Target->TargetTypeValue == UTILITY))
  goto LAB_00418b06;
  std::__cxx11::string::string((string *)&local_58,"HEADER_FILE_ONLY",&local_61);
  bVar1 = cmSourceFile::GetPropertyAsBool(sf,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) goto LAB_00418b06;
  std::__cxx11::string::string((string *)&local_58,"EXTERNAL_OBJECT",&local_61);
  bVar1 = cmSourceFile::GetPropertyAsBool(sf,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
LAB_00418aca:
    if (this->IsObjLib == false) goto LAB_00418b06;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_(&local_58,sf);
    std::__cxx11::string::~string((string *)&local_58);
    if (local_58._M_string_length != 0) goto LAB_00418b06;
    bVar1 = std::operator==(&local_38,"def");
    if (bVar1) {
      DoAccept<true>::Do(this->Data,local_60);
      goto LAB_00418aca;
    }
    bVar1 = std::operator==(&local_38,"idl");
    if (!bVar1) {
      bVar1 = std::operator==(&local_38,"resx");
      if ((((!bVar1) && (bVar1 = std::operator==(&local_38,"appxmanifest"), !bVar1)) &&
          (bVar1 = std::operator==(&local_38,"pfx"), !bVar1)) &&
         (bVar1 = std::operator==(&local_38,"xaml"), !bVar1)) {
        psVar2 = cmSourceFile::GetFullPath(local_60,(string *)0x0);
        bVar1 = cmsys::RegularExpression::find(&this->Header,(psVar2->_M_dataplus)._M_p);
        if (!bVar1) {
          this_00 = this->GlobalGenerator;
          psVar2 = cmSourceFile::GetExtension_abi_cxx11_(local_60);
          cmGlobalGenerator::IgnoreFile(this_00,(psVar2->_M_dataplus)._M_p);
        }
      }
      goto LAB_00418b06;
    }
    if (this->IsObjLib != true) goto LAB_00418b06;
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
            (&this->BadObjLibFiles,&local_60);
LAB_00418b06:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Accept(cmSourceFile *sf)
  {
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if(sf->GetCustomCommand())
      {
      DoAccept<IsSameTag<Tag, CustomCommandsTag>::Result>::Do(this->Data, sf);
      }
    else if(this->Target->GetType() == cmTarget::UTILITY)
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(sf->GetPropertyAsBool("HEADER_FILE_ONLY"))
      {
      DoAccept<IsSameTag<Tag, HeaderSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(sf->GetPropertyAsBool("EXTERNAL_OBJECT"))
      {
      DoAccept<IsSameTag<Tag, ExternalObjectsTag>::Result>::Do(this->Data, sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(!sf->GetLanguage().empty())
      {
      DoAccept<IsSameTag<Tag, ObjectSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(ext == "def")
      {
      DoAccept<IsSameTag<Tag, ModuleDefinitionFileTag>::Result>::Do(this->Data,
                                                                    sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(ext == "idl")
      {
      DoAccept<IsSameTag<Tag, IDLSourcesTag>::Result>::Do(this->Data, sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(ext == "resx")
      {
      DoAccept<IsSameTag<Tag, ResxTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "appxmanifest")
      {
      DoAccept<IsSameTag<Tag, AppManifestTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "pfx")
      {
      DoAccept<IsSameTag<Tag, CertificatesTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "xaml")
      {
      DoAccept<IsSameTag<Tag, XamlTag>::Result>::Do(this->Data, sf);
      }
    else if(this->Header.find(sf->GetFullPath().c_str()))
      {
      DoAccept<IsSameTag<Tag, HeaderSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(this->GlobalGenerator->IgnoreFile(sf->GetExtension().c_str()))
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
    else
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
  }